

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GuillotineBinPack.cpp
# Opt level: O3

float __thiscall GuillotineBinPack::Occupancy(GuillotineBinPack *this)

{
  Rect *pRVar1;
  ulong uVar2;
  ulong uVar3;
  long lVar4;
  float fVar5;
  
  uVar3 = (ulong)(this->usedRectangles).Count;
  if (uVar3 == 0) {
    fVar5 = 0.0;
  }
  else {
    pRVar1 = (this->usedRectangles).Array;
    lVar4 = 0;
    uVar2 = 0;
    do {
      uVar2 = uVar2 + (long)*(int *)((long)&pRVar1->height + lVar4) *
                      (long)*(int *)((long)&pRVar1->width + lVar4);
      lVar4 = lVar4 + 0x10;
    } while (uVar3 << 4 != lVar4);
    if ((long)uVar2 < 0) {
      fVar5 = (float)uVar2;
    }
    else {
      fVar5 = (float)(long)uVar2;
    }
  }
  return fVar5 / (float)(this->binHeight * this->binWidth);
}

Assistant:

float GuillotineBinPack::Occupancy() const
{
	///\todo The occupancy rate could be cached/tracked incrementally instead
	///      of looping through the list of packed rectangles here.
	unsigned long usedSurfaceArea = 0;
	for(unsigned i = 0; i < usedRectangles.Size(); ++i)
		usedSurfaceArea += usedRectangles[i].width * usedRectangles[i].height;

	return (float)usedSurfaceArea / (binWidth * binHeight);
}